

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

int abs(int __x)

{
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  undefined4 in_register_0000003c;
  vector<Blade,_std::allocator<Blade>_> *__x_00;
  Clifford temp;
  Clifford xb;
  vector<Blade,_std::allocator<Blade>_> local_e0;
  vector<Blade,_std::allocator<Blade>_> local_c8;
  vector<Blade,_std::allocator<Blade>_> local_b0;
  Clifford local_98;
  Clifford local_80;
  vector<Blade,_std::allocator<Blade>_> local_68;
  vector<Blade,_std::allocator<Blade>_> local_50;
  vector<Blade,_std::allocator<Blade>_> local_38;
  
  __x_00 = (vector<Blade,_std::allocator<Blade>_> *)CONCAT44(in_register_0000003c,__x);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_50,__x_00);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_38,__x_00);
  bVar1 = isScalar(&local_38);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_38);
  iVar2 = extraout_EAX;
  if (!bVar1) {
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_68,__x_00);
    operator!(&local_80,&local_68);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_68);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_b0,__x_00);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c8,&local_80);
    operator|(&local_98,&local_b0,&local_c8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b0);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_e0,&local_98);
    abs((int)&local_e0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_98);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_80);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

float abs(Clifford A)
{
	float sk; sk<=A;

	if(isScalar(A))
	{
		return sqrt(fabs(sk));
	}

	Clifford xb = !A;
	Clifford temp = A|xb;
	return abs(temp);


}